

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O0

int __thiscall
Imf_2_5::TypedAttribute<Imath_2_5::Vec3<float>_>::copy
          (TypedAttribute<Imath_2_5::Vec3<float>_> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  long *plVar1;
  Attribute *attribute;
  TypedAttribute<Imath_2_5::Vec3<float>_> *in_stack_ffffffffffffffe0;
  
  plVar1 = (long *)operator_new(0x18);
  *plVar1 = 0;
  plVar1[1] = 0;
  plVar1[2] = 0;
  TypedAttribute(in_stack_ffffffffffffffe0);
  (**(code **)(*plVar1 + 0x30))(plVar1,this);
  return (int)plVar1;
}

Assistant:

Attribute *
TypedAttribute<T>::copy () const
{
    Attribute * attribute = new TypedAttribute<T>();
    attribute->copyValueFrom (*this);
    return attribute;
}